

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entry.cpp
# Opt level: O0

string_view libtorrent::aux::integer_to_str(array<char,_21UL> *buf,integer_type val)

{
  reference pvVar1;
  pointer pvVar2;
  char *pcVar3;
  char *local_38;
  char *ptr;
  long lStack_28;
  int sign;
  integer_type val_local;
  array<char,_21UL> *buf_local;
  
  if (-1 < val) {
    if (val < 10) {
      pvVar1 = ::std::array<char,_21UL>::operator[](buf,0);
      *pvVar1 = (char)val + '0';
      pvVar2 = ::std::array<char,_21UL>::data(buf);
      ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&buf_local,pvVar2,1);
      return _buf_local;
    }
    if (val < 100) {
      pvVar1 = ::std::array<char,_21UL>::operator[](buf,0);
      *pvVar1 = (char)((val / 10) % 10) + '0';
      pvVar1 = ::std::array<char,_21UL>::operator[](buf,1);
      *pvVar1 = (char)(val % 10) + '0';
      pvVar2 = ::std::array<char,_21UL>::data(buf);
      ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&buf_local,pvVar2,2);
      return _buf_local;
    }
    if (val < 1000) {
      pvVar1 = ::std::array<char,_21UL>::operator[](buf,0);
      *pvVar1 = (char)((val / 100) % 10) + '0';
      pvVar1 = ::std::array<char,_21UL>::operator[](buf,1);
      *pvVar1 = (char)((val / 10) % 10) + '0';
      pvVar1 = ::std::array<char,_21UL>::operator[](buf,2);
      *pvVar1 = (char)(val % 10) + '0';
      pvVar2 = ::std::array<char,_21UL>::data(buf);
      ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&buf_local,pvVar2,3);
      return _buf_local;
    }
    if (val < 10000) {
      pvVar1 = ::std::array<char,_21UL>::operator[](buf,0);
      *pvVar1 = (char)((val / 1000) % 10) + '0';
      pvVar1 = ::std::array<char,_21UL>::operator[](buf,1);
      *pvVar1 = (char)((val / 100) % 10) + '0';
      pvVar1 = ::std::array<char,_21UL>::operator[](buf,2);
      *pvVar1 = (char)((val / 10) % 10) + '0';
      pvVar1 = ::std::array<char,_21UL>::operator[](buf,3);
      *pvVar1 = (char)(val % 10) + '0';
      pvVar2 = ::std::array<char,_21UL>::data(buf);
      ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&buf_local,pvVar2,4);
      return _buf_local;
    }
    if (val < 100000) {
      pvVar1 = ::std::array<char,_21UL>::operator[](buf,0);
      *pvVar1 = (char)((val / 10000) % 10) + '0';
      pvVar1 = ::std::array<char,_21UL>::operator[](buf,1);
      *pvVar1 = (char)((val / 1000) % 10) + '0';
      pvVar1 = ::std::array<char,_21UL>::operator[](buf,2);
      *pvVar1 = (char)((val / 100) % 10) + '0';
      pvVar1 = ::std::array<char,_21UL>::operator[](buf,3);
      *pvVar1 = (char)((val / 10) % 10) + '0';
      pvVar1 = ::std::array<char,_21UL>::operator[](buf,4);
      *pvVar1 = (char)(val % 10) + '0';
      pvVar2 = ::std::array<char,_21UL>::data(buf);
      ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&buf_local,pvVar2,5);
      return _buf_local;
    }
  }
  lStack_28 = val;
  if (0 < val) {
    lStack_28 = -val;
  }
  pcVar3 = ::std::array<char,_21UL>::back(buf);
  do {
    local_38 = pcVar3;
    pcVar3 = local_38 + -1;
    *local_38 = '0' - (char)(lStack_28 % 10);
    lStack_28 = lStack_28 / 10;
  } while (lStack_28 != 0);
  if (0 >= val) {
    *pcVar3 = '-';
    pcVar3 = local_38 + -2;
  }
  local_38 = pcVar3;
  pvVar1 = ::std::array<char,_21UL>::back(buf);
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&buf_local,local_38 + 1,
             (size_type)(pvVar1 + (1 - (long)(local_38 + 1))));
  return _buf_local;
}

Assistant:

string_view integer_to_str(std::array<char, 21>& buf, entry::integer_type val)
	{
		if (val >= 0)
		{
			if (val < 10)
			{
				buf[0] = '0' + static_cast<char>(val);
				return {buf.data(), std::size_t(1)};
			}
			if (val < 100)
			{
				buf[0] = '0' + (val / 10) % 10;
				buf[1] = '0' + val % 10;
				return {buf.data(), std::size_t(2)};
			}
			if (val < 1000)
			{
				buf[0] = '0' + (val / 100) % 10;
				buf[1] = '0' + (val / 10) % 10;
				buf[2] = '0' + val % 10;
				return {buf.data(), std::size_t(3)};
			}
			if (val < 10000)
			{
				buf[0] = '0' + (val / 1000) % 10;
				buf[1] = '0' + (val / 100) % 10;
				buf[2] = '0' + (val / 10) % 10;
				buf[3] = '0' + val % 10;
				return {buf.data(), std::size_t(4)};
			}
			if (val < 100000)
			{
				buf[0] = '0' + (val / 10000) % 10;
				buf[1] = '0' + (val / 1000) % 10;
				buf[2] = '0' + (val / 100) % 10;
				buf[3] = '0' + (val / 10) % 10;
				buf[4] = '0' + val % 10;
				return {buf.data(), std::size_t(5)};
			}
		}
		// val == 0 is handled in the fast-path above
		TORRENT_ASSERT(val != 0);
		// slow path
		// convert positive values to negative, since the negative space is
		// larger, so we can fit INT64_MIN
		int sign = 1;
		if (val > 0)
		{
			sign = 0;
			val = -val;
		}
		char* ptr = &buf.back();
		do
		{
			*ptr-- = '0' - char(val % 10);
			val /= 10;
		} while (val != 0);
		if (sign) *ptr-- = '-';
		++ptr;
		return {ptr, static_cast<std::size_t>(&buf.back() - ptr + 1)};
	}